

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

cb_class CB_ADF::get_observed_cost(multi_ex *examples)

{
  pointer ppeVar1;
  wclass *pwVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  example **ec;
  pointer ppeVar6;
  multi_ex *__range1;
  wclass *pwVar7;
  undefined8 uVar8;
  cb_class cVar9;
  
  uVar3 = 0xffffffff00000000;
  ppeVar6 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar1 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar8 = 0xbf800000;
  uVar4 = 0;
  if (ppeVar6 != ppeVar1) {
    uVar5 = 0xffffffff;
    pwVar7 = (wclass *)0x0;
    do {
      pwVar2 = ((*ppeVar6)->l).cs.costs._begin;
      if (((long)((*ppeVar6)->l).cs.costs._end - (long)pwVar2 == 0x10) &&
         (((pwVar2->x != 3.4028235e+38 || (NAN(pwVar2->x))) && (0.0 < pwVar2->partial_prediction))))
      {
        uVar5 = uVar4;
        pwVar7 = pwVar2;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      ppeVar6 = ppeVar6 + 1;
    } while (ppeVar6 != ppeVar1);
    if ((int)uVar5 == -1) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)(uint)pwVar7->x;
      uVar8._0_4_ = pwVar7->partial_prediction;
      uVar8._4_4_ = pwVar7->wap_value;
      uVar3 = uVar5 << 0x20;
    }
  }
  cVar9._0_8_ = uVar3 | uVar4;
  cVar9.probability = (float)(int)uVar8;
  cVar9.partial_prediction = (float)(int)((ulong)uVar8 >> 0x20);
  return cVar9;
}

Assistant:

CB::cb_class get_observed_cost(multi_ex& examples)
{
  CB::label ld;
  ld.costs = v_init<cb_class>();
  int index = -1;
  CB::cb_class known_cost;

  size_t i = 0;
  for (example*& ec : examples)
  {
    if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX && ec->l.cb.costs[0].probability > 0)
    {
      ld = ec->l.cb;
      index = (int)i;
    }
    ++i;
  }

  // handle -1 case.
  if (index == -1)
  {
    known_cost.probability = -1;
    return known_cost;
    // std::cerr << "None of the examples has known cost. Exiting." << endl;
    // throw exception();
  }

  known_cost = ld.costs[0];
  known_cost.action = index;
  return known_cost;
}